

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O2

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::scan(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  vector<bool,_std::allocator<bool>_> *this;
  Id IVar1;
  Expression *this_00;
  If *pIVar2;
  TryTable *pTVar3;
  Loop *pLVar4;
  LocalSet *pLVar5;
  Try *pTVar6;
  Expression **ppEVar7;
  Break *pBVar8;
  Block *pBVar9;
  LocalGet *pLVar10;
  StackSwitch *pSVar11;
  Suspend *pSVar12;
  StringNew *pSVar13;
  Store *pSVar14;
  CallRef *pCVar15;
  ArrayNew *pAVar16;
  TupleMake *pTVar17;
  Load *pLVar18;
  Switch *pSVar19;
  CallIndirect *pCVar20;
  Return *pRVar21;
  SIMDLoad *pSVar22;
  Call *pCVar23;
  ContBind *pCVar24;
  GlobalSet *pGVar25;
  MemoryCopy *pMVar26;
  Throw *pTVar27;
  AtomicWait *pAVar28;
  ResumeThrow *pRVar29;
  StructNew *pSVar30;
  StructGet *pSVar31;
  AtomicCmpxchg *pAVar32;
  ArrayNewFixed *pAVar33;
  Resume *pRVar34;
  Expression **currp_00;
  Expression **currp_01;
  Expression **extraout_RDX;
  Expression **currp_02;
  Expression **currp_03;
  Expression **currp_04;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_05;
  Name *currp_06;
  ulong uVar35;
  reference rVar36;
  uint local_44;
  vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
  *pvStack_40;
  Index index;
  Scanner *local_38;
  
  pvStack_40 = &self->cleanupStack;
  this = &self->localsSet;
  local_38 = self;
  do {
    this_00 = *currp;
    IVar1 = this_00->_id;
    switch(IVar1) {
    case InvalidId:
      handle_unreachable("bad id",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                         ,0x89);
    case BlockId:
      pBVar9 = Expression::cast<wasm::Block>(this_00);
      if ((pBVar9->name).super_IString.str._M_str != (char *)0x0) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doEndScope(Scanner*,wasm::Expression___,currp);
      }
      uVar35 = (ulong)(uint)(pBVar9->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            .usedElements;
      while (0 < (int)uVar35) {
        uVar35 = uVar35 - 1;
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(pBVar9->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,uVar35);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,ppEVar7)
        ;
      }
      if ((pBVar9->name).super_IString.str._M_str == (char *)0x0) {
        return;
      }
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::emplace_back<>(pvStack_40);
      return;
    case IfId:
      pIVar2 = Expression::cast<wasm::If>(this_00);
      if (pIVar2->ifFalse != (Expression *)0x0) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doEndScope(Scanner*,wasm::Expression___,currp);
        pIVar2 = Expression::cast<wasm::If>(this_00);
        maybePushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (self,(TaskFunc)&pIVar2->ifFalse,currp_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doBeginScope(Scanner*,wasm::Expression___,currp);
      }
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      pIVar2 = Expression::cast<wasm::If>(this_00);
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 &pIVar2->ifTrue);
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doBeginScope(Scanner*,wasm::Expression___,currp);
      pTVar3 = (TryTable *)Expression::cast<wasm::If>(this_00);
LAB_0090535c:
      currp = &pTVar3->body;
      break;
    case LoopId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::emplace_back<>(pvStack_40);
      pLVar4 = Expression::cast<wasm::Loop>(this_00);
      currp = &pLVar4->body;
      break;
    case BreakId:
    case SwitchId:
    case CallId:
    case CallIndirectId:
code_r0x00905475:
      switch(IVar1) {
      case InvalidId:
      case NumExpressionIds:
        handle_unreachable("unexpected expression type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                           ,0x103);
      default:
        goto switchD_00905485_caseD_1;
      case BreakId:
        pBVar8 = Expression::cast<wasm::Break>(this_00);
        maybePushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (self,(TaskFunc)&pBVar8->condition,currp_01);
        ppEVar7 = &pBVar8->value;
        currp_05 = extraout_RDX;
        goto LAB_009058fd;
      case SwitchId:
        pSVar19 = Expression::cast<wasm::Switch>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pSVar19->condition);
        ppEVar7 = &pSVar19->value;
        currp_05 = extraout_RDX_01;
        goto LAB_009058fd;
      case CallId:
        pCVar23 = Expression::cast<wasm::Call>(this_00);
        uVar35 = (ulong)(uint)(pCVar23->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pCVar23->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case CallIndirectId:
        pCVar20 = Expression::cast<wasm::CallIndirect>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pCVar20->target);
        uVar35 = (ulong)(uint)(pCVar20->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pCVar20->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case GlobalGetId:
        Expression::cast<wasm::GlobalGet>(this_00);
        return;
      case GlobalSetId:
        pGVar25 = Expression::cast<wasm::GlobalSet>(this_00);
        goto LAB_00905aea;
      case LoadId:
        pLVar18 = Expression::cast<wasm::Load>(this_00);
        ppEVar7 = &pLVar18->ptr;
        goto LAB_00905ed4;
      case StoreId:
        pSVar14 = Expression::cast<wasm::Store>(this_00);
        goto LAB_00905955;
      case ConstId:
        Expression::cast<wasm::Const>(this_00);
        return;
      case UnaryId:
        pSVar31 = (StructGet *)Expression::cast<wasm::Unary>(this_00);
        goto LAB_00905da0;
      case BinaryId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::Binary>(this_00);
        goto LAB_00905d35;
      case SelectId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::Select>(this_00);
        goto LAB_00905e32;
      case DropId:
        pTVar3 = (TryTable *)Expression::cast<wasm::Drop>(this_00);
        break;
      case ReturnId:
        pRVar21 = Expression::cast<wasm::Return>(this_00);
        ppEVar7 = &pRVar21->value;
        currp_05 = extraout_RDX_02;
        goto LAB_009058fd;
      case MemorySizeId:
        Expression::cast<wasm::MemorySize>(this_00);
        return;
      case MemoryGrowId:
        pTVar3 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this_00);
        break;
      case NopId:
        Expression::cast<wasm::Nop>(this_00);
        return;
      case UnreachableId:
        Expression::cast<wasm::Unreachable>(this_00);
        return;
      case AtomicRMWId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this_00);
        goto LAB_00905dea;
      case AtomicCmpxchgId:
        pAVar32 = Expression::cast<wasm::AtomicCmpxchg>(this_00);
        goto LAB_00905ddb;
      case AtomicWaitId:
        pAVar28 = Expression::cast<wasm::AtomicWait>(this_00);
        goto LAB_00905b3d;
      case AtomicNotifyId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this_00);
        goto LAB_00905d35;
      case AtomicFenceId:
        Expression::cast<wasm::AtomicFence>(this_00);
        return;
      case SIMDExtractId:
        pSVar31 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this_00);
        goto LAB_00905da0;
      case SIMDReplaceId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this_00);
        currp_06 = (Name *)&pAVar28->timeout;
        goto LAB_00905d43;
      case SIMDShuffleId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this_00);
        goto LAB_00905ebc;
      case SIMDTernaryId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this_00);
        goto LAB_00905b3d;
      case SIMDShiftId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this_00);
        goto LAB_00905d35;
      case SIMDLoadId:
        pSVar22 = Expression::cast<wasm::SIMDLoad>(this_00);
        goto LAB_00905afb;
      case SIMDLoadStoreLaneId:
        pSVar14 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this_00);
LAB_00905955:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pSVar14->value);
        ppEVar7 = &pSVar14->ptr;
        goto LAB_00905ed4;
      case MemoryInitId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this_00);
        goto LAB_00905ddb;
      case DataDropId:
        Expression::cast<wasm::DataDrop>(this_00);
        return;
      case MemoryCopyId:
        pMVar26 = Expression::cast<wasm::MemoryCopy>(this_00);
        goto LAB_00905e32;
      case MemoryFillId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this_00);
        goto LAB_00905e32;
      case PopId:
        Expression::cast<wasm::Pop>(this_00);
        return;
      case RefNullId:
        Expression::cast<wasm::RefNull>(this_00);
        return;
      case RefIsNullId:
        pTVar3 = (TryTable *)Expression::cast<wasm::RefIsNull>(this_00);
        break;
      case RefFuncId:
        Expression::cast<wasm::RefFunc>(this_00);
        return;
      case RefEqId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this_00);
        goto LAB_00905ebc;
      case TableGetId:
        pGVar25 = (GlobalSet *)Expression::cast<wasm::TableGet>(this_00);
LAB_00905aea:
        ppEVar7 = &pGVar25->value;
        goto LAB_00905ed4;
      case TableSetId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this_00);
        goto LAB_00905dea;
      case TableSizeId:
        Expression::cast<wasm::TableSize>(this_00);
        return;
      case TableGrowId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this_00);
        goto LAB_00905dea;
      case TableFillId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this_00);
        goto LAB_00905ddb;
      case TableCopyId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this_00);
        goto LAB_00905e32;
      case TableInitId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this_00);
        goto LAB_00905ddb;
      case TryId:
        pTVar6 = Expression::cast<wasm::Try>(this_00);
        uVar35 = (ulong)(uint)(pTVar6->catchBodies).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pTVar6->catchBodies).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                     ppEVar7);
        }
        ppEVar7 = &pTVar6->body;
        self = local_38;
LAB_00905ed4:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        return;
      case TryTableId:
        pTVar3 = Expression::cast<wasm::TryTable>(this_00);
        break;
      case ThrowId:
        pTVar27 = Expression::cast<wasm::Throw>(this_00);
        uVar35 = (ulong)(uint)(pTVar27->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pTVar27->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case RethrowId:
        Expression::cast<wasm::Rethrow>(this_00);
        return;
      case ThrowRefId:
        pTVar3 = (TryTable *)Expression::cast<wasm::ThrowRef>(this_00);
        break;
      case TupleMakeId:
        pTVar17 = Expression::cast<wasm::TupleMake>(this_00);
        uVar35 = (ulong)(uint)(pTVar17->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pTVar17->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case TupleExtractId:
        pTVar3 = (TryTable *)Expression::cast<wasm::TupleExtract>(this_00);
        break;
      case RefI31Id:
        pTVar3 = (TryTable *)Expression::cast<wasm::RefI31>(this_00);
        break;
      case I31GetId:
        pTVar3 = (TryTable *)Expression::cast<wasm::I31Get>(this_00);
        break;
      case CallRefId:
        pCVar15 = Expression::cast<wasm::CallRef>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pCVar15->target);
        uVar35 = (ulong)(uint)(pCVar15->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pCVar15->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case RefTestId:
        pTVar3 = (TryTable *)Expression::cast<wasm::RefTest>(this_00);
        break;
      case RefCastId:
        pTVar3 = (TryTable *)Expression::cast<wasm::RefCast>(this_00);
        break;
      case BrOnId:
        pSVar22 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this_00);
LAB_00905afb:
        ppEVar7 = &pSVar22->ptr;
        goto LAB_00905ed4;
      case StructNewId:
        pSVar30 = Expression::cast<wasm::StructNew>(this_00);
        uVar35 = (ulong)(uint)(pSVar30->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pSVar30->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case StructGetId:
        pSVar31 = Expression::cast<wasm::StructGet>(this_00);
        goto LAB_00905da0;
      case StructSetId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::StructSet>(this_00);
        goto LAB_00905d35;
      case StructRMWId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this_00);
        goto LAB_00905d35;
      case StructCmpxchgId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this_00);
LAB_00905b3d:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pAVar28->timeout);
        currp_06 = (Name *)&pAVar28->expected;
        goto LAB_00905d43;
      case ArrayNewId:
        pAVar16 = Expression::cast<wasm::ArrayNew>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pAVar16->size);
        ppEVar7 = &pAVar16->init;
        currp_05 = extraout_RDX_00;
LAB_009058fd:
        maybePushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (self,(TaskFunc)ppEVar7,currp_05);
        return;
      case ArrayNewDataId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this_00);
        goto LAB_00905dea;
      case ArrayNewElemId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this_00);
        goto LAB_00905dea;
      case ArrayNewFixedId:
        pAVar33 = Expression::cast<wasm::ArrayNewFixed>(this_00);
        uVar35 = (ulong)(uint)(pAVar33->values).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pAVar33->values).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case ArrayGetId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this_00);
        goto LAB_00905ebc;
      case ArraySetId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this_00);
        goto LAB_00905e32;
      case ArrayLenId:
        pTVar3 = (TryTable *)Expression::cast<wasm::ArrayLen>(this_00);
        break;
      case ArrayCopyId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&(pMVar26->destMemory).super_IString.str._M_str);
        goto LAB_00905e23;
      case ArrayFillId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this_00);
LAB_00905e23:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pMVar26->destMemory);
        goto LAB_00905e32;
      case ArrayInitDataId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this_00);
        goto LAB_00905dbe;
      case ArrayInitElemId:
        pAVar32 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this_00);
LAB_00905dbe:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pAVar32->memory);
LAB_00905ddb:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pAVar32->replacement);
LAB_00905dea:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pAVar32->expected);
        ppEVar7 = &pAVar32->ptr;
        goto LAB_00905ed4;
      case RefAsId:
        pSVar31 = (StructGet *)Expression::cast<wasm::RefAs>(this_00);
        goto LAB_00905da0;
      case StringNewId:
        pSVar13 = Expression::cast<wasm::StringNew>(this_00);
        maybePushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (self,(TaskFunc)&pSVar13->end,currp_02);
        maybePushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (self,(TaskFunc)&pSVar13->start,currp_03);
        ppEVar7 = &pSVar13->ref;
        goto LAB_00905ed4;
      case StringConstId:
        Expression::cast<wasm::StringConst>(this_00);
        return;
      case StringMeasureId:
        pSVar31 = (StructGet *)Expression::cast<wasm::StringMeasure>(this_00);
LAB_00905da0:
        ppEVar7 = &pSVar31->ref;
        goto LAB_00905ed4;
      case StringEncodeId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this_00);
        maybePushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (self,(TaskFunc)&pAVar28->timeout,currp_04);
        currp_06 = (Name *)&pAVar28->expected;
        goto LAB_00905d43;
      case StringConcatId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this_00);
        goto LAB_00905ebc;
      case StringEqId:
        pAVar28 = (AtomicWait *)Expression::cast<wasm::StringEq>(this_00);
LAB_00905d35:
        currp_06 = (Name *)&pAVar28->expected;
LAB_00905d43:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)currp_06);
        ppEVar7 = &pAVar28->ptr;
        goto LAB_00905ed4;
      case StringWTF16GetId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this_00);
        goto LAB_00905ebc;
      case StringSliceWTFId:
        pMVar26 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this_00);
LAB_00905e32:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pMVar26->size);
LAB_00905ebc:
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pMVar26->source);
        ppEVar7 = &pMVar26->dest;
        goto LAB_00905ed4;
      case ContNewId:
        pTVar3 = (TryTable *)Expression::cast<wasm::ContNew>(this_00);
        break;
      case ContBindId:
        pCVar24 = Expression::cast<wasm::ContBind>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pCVar24->cont);
        uVar35 = (ulong)(uint)(pCVar24->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pCVar24->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case SuspendId:
        pSVar12 = Expression::cast<wasm::Suspend>(this_00);
        uVar35 = (ulong)(uint)(pSVar12->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pSVar12->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case ResumeId:
        pRVar34 = Expression::cast<wasm::Resume>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pRVar34->cont);
        uVar35 = (ulong)(uint)(pRVar34->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pRVar34->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case ResumeThrowId:
        pRVar29 = Expression::cast<wasm::ResumeThrow>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pRVar29->cont);
        uVar35 = (ulong)(uint)(pRVar29->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pRVar29->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        return;
      case StackSwitchId:
        pSVar11 = Expression::cast<wasm::StackSwitch>(this_00);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   &pSVar11->cont);
        uVar35 = (ulong)(uint)(pSVar11->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
        while (0 < (int)uVar35) {
          uVar35 = uVar35 - 1;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(pSVar11->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar35);
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        }
        goto switchD_00905485_caseD_1;
      }
      ppEVar7 = &pTVar3->body;
      goto LAB_00905ed4;
    case LocalGetId:
      pLVar10 = Expression::cast<wasm::LocalGet>(this_00);
      local_44 = pLVar10->index;
      rVar36 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(ulong)local_44);
      if ((*rVar36._M_p & rVar36._M_mask) != 0) {
        return;
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)self->nonDominatingIndices,&local_44);
      return;
    case LocalSetId:
      pLVar5 = Expression::cast<wasm::LocalSet>(this_00);
      rVar36 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(ulong)pLVar5->index);
      if ((*rVar36._M_p & rVar36._M_mask) == 0) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doLocalSet(Scanner*,wasm::Expression___,currp);
      }
      currp = &pLVar5->value;
      break;
    default:
      if (IVar1 != TryId) {
        if (IVar1 != TryTableId) goto code_r0x00905475;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doEndScope(Scanner*,wasm::Expression___,currp);
        std::
        vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
        ::emplace_back<>(pvStack_40);
        pTVar3 = Expression::cast<wasm::TryTable>(this_00);
        goto LAB_0090535c;
      }
      pTVar6 = Expression::cast<wasm::Try>(this_00);
      uVar35 = (ulong)(uint)(pTVar6->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            .usedElements;
      while (self = local_38, 0 < (int)uVar35) {
        uVar35 = uVar35 - 1;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,
                   doEndScope(Scanner*,wasm::Expression___,currp);
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(pTVar6->catchBodies).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,uVar35);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,ppEVar7);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doBeginScope(Scanner*,wasm::Expression___,currp);
      }
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::emplace_back<>(pvStack_40);
      pTVar6 = Expression::cast<wasm::Try>(this_00);
      currp = &pTVar6->body;
    }
  } while( true );
switchD_00905485_caseD_1:
  return;
}

Assistant:

static void scan(Scanner* self, Expression** currp) {
      // Use a loop to avoid recursing on the last child - we can just go
      // straight into a loop iteration for it.
      while (1) {
        Expression* curr = *currp;

        switch (curr->_id) {
          case Expression::Id::InvalidId:
            WASM_UNREACHABLE("bad id");

          // local.get can just be visited immediately, as it has no children.
          case Expression::Id::LocalGetId: {
            auto index = curr->cast<LocalGet>()->index;
            if (!self->localsSet[index]) {
              self->nonDominatingIndices.insert(index);
            }
            return;
          }
          case Expression::Id::LocalSetId: {
            auto* set = curr->cast<LocalSet>();
            if (!self->localsSet[set->index]) {
              self->pushTask(doLocalSet, currp);
            }
            // Immediately continue in the loop.
            currp = &set->value;
            continue;
          }

          // Control flow structures.
          case Expression::Id::BlockId: {
            auto* block = curr->cast<Block>();
            // Blocks with no name are never emitted in the binary format, so do
            // not create a scope for them.
            if (block->name.is()) {
              self->pushTask(Scanner::doEndScope, currp);
            }
            auto& list = block->list;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::scan, &list[i]);
            }
            if (block->name.is()) {
              // Just call the task immediately.
              doBeginScope(self, currp);
            }
            return;
          }
          case Expression::Id::IfId: {
            if (curr->cast<If>()->ifFalse) {
              self->pushTask(Scanner::doEndScope, currp);
              self->maybePushTask(Scanner::scan, &curr->cast<If>()->ifFalse);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            self->pushTask(Scanner::scan, &curr->cast<If>()->ifTrue);
            self->pushTask(Scanner::doBeginScope, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<If>()->condition;
            continue;
          }
          case Expression::Id::LoopId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Loop>()->body;
            continue;
          }
          case Expression::Id::TryId: {
            auto& list = curr->cast<Try>()->catchBodies;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::doEndScope, currp);
              self->pushTask(Scanner::scan, &list[i]);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Try>()->body;
            continue;
          }
          case Expression::Id::TryTableId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the try_table.
            currp = &curr->cast<TryTable>()->body;
            continue;
          }

          default: {
            // Control flow structures have been handled. This is an expression,
            // which we scan normally.
            assert(!Properties::isControlFlowStructure(curr));
            PostWalker<Scanner>::scan(self, currp);
            return;
          }
        }
      }
    }